

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_result
drwav__read_chunk_header
          (drwav_read_proc onRead,void *pUserData,drwav_container container,
          drwav_uint64 *pRunningBytesReadOut,drwav_chunk_header *pHeaderOut)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  drwav_uint8 sizeInBytes_1 [4];
  drwav_uint8 sizeInBytes [8];
  byte local_2c;
  byte local_2b;
  byte local_2a;
  byte local_29;
  byte local_28;
  undefined7 local_27;
  
  if ((container & ~drwav_container_rf64) == drwav_container_riff) {
    sVar3 = (*onRead)(pUserData,pHeaderOut,4);
    if (sVar3 == 4) {
      sVar3 = (*onRead)(pUserData,&local_2c,4);
      if (sVar3 != 4) goto LAB_00122e0d;
      pHeaderOut->sizeInBytes =
           (ulong)((uint)local_29 << 0x18 | (uint)local_2a << 0x10 | (uint)local_2b << 8 |
                  (uint)local_2c);
      uVar2 = local_2c & 1;
      pHeaderOut->paddingSize = uVar2;
      *pRunningBytesReadOut = *pRunningBytesReadOut + 8;
LAB_00122e02:
      bVar1 = true;
      goto LAB_00122e14;
    }
LAB_00122e06:
    uVar2 = 0xffffffcb;
  }
  else {
    sVar3 = (*onRead)(pUserData,pHeaderOut,0x10);
    if (sVar3 != 0x10) goto LAB_00122e06;
    sVar3 = (*onRead)(pUserData,&local_28,8);
    if (sVar3 == 8) {
      pHeaderOut->sizeInBytes = CONCAT71(local_27,local_28) - 0x18;
      uVar2 = local_28 & 7;
      pHeaderOut->paddingSize = uVar2;
      *pRunningBytesReadOut = *pRunningBytesReadOut + 0x18;
      goto LAB_00122e02;
    }
LAB_00122e0d:
    uVar2 = 0xfffffff6;
  }
  bVar1 = false;
LAB_00122e14:
  if (bVar1) {
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

static drwav_result drwav__read_chunk_header(drwav_read_proc onRead, void* pUserData, drwav_container container, drwav_uint64* pRunningBytesReadOut, drwav_chunk_header* pHeaderOut)
{
    if (container == drwav_container_riff || container == drwav_container_rf64) {
        drwav_uint8 sizeInBytes[4];

        if (onRead(pUserData, pHeaderOut->id.fourcc, 4) != 4) {
            return DRWAV_AT_END;
        }

        if (onRead(pUserData, sizeInBytes, 4) != 4) {
            return DRWAV_INVALID_FILE;
        }

        pHeaderOut->sizeInBytes = drwav__bytes_to_u32(sizeInBytes);
        pHeaderOut->paddingSize = drwav__chunk_padding_size_riff(pHeaderOut->sizeInBytes);
        *pRunningBytesReadOut += 8;
    } else {
        drwav_uint8 sizeInBytes[8];

        if (onRead(pUserData, pHeaderOut->id.guid, 16) != 16) {
            return DRWAV_AT_END;
        }

        if (onRead(pUserData, sizeInBytes, 8) != 8) {
            return DRWAV_INVALID_FILE;
        }

        pHeaderOut->sizeInBytes = drwav__bytes_to_u64(sizeInBytes) - 24;    /* <-- Subtract 24 because w64 includes the size of the header. */
        pHeaderOut->paddingSize = drwav__chunk_padding_size_w64(pHeaderOut->sizeInBytes);
        *pRunningBytesReadOut += 24;
    }

    return DRWAV_SUCCESS;
}